

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priNextPrimeW(word *p,word a,void *stack)

{
  bool_t bVar1;
  size_t n;
  size_t sVar2;
  word *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t l;
  void *in_stack_00000020;
  word in_stack_00000028;
  size_t in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI;
  n = wwBitSize(in_RDX,in_stack_ffffffffffffffd8);
  if (1 < n) {
    *in_RDI = *in_RDI | 1;
    do {
      bVar1 = priIsPrimeW(in_stack_00000028,in_stack_00000020);
      if (bVar1 != 0) {
        return 1;
      }
      *in_RDI = *in_RDI + 2;
      sVar2 = wwBitSize(in_RDX,n);
    } while (sVar2 == n);
  }
  return 0;
}

Assistant:

bool_t priNextPrimeW(word p[1], register word a, void* stack)
{
	register size_t l;
	// p <- a, l <- битовая длина a
	p[0] = a, l = wwBitSize(p, 1);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// сделать p нечетным
	p[0] |= 1;
	// поиск
	while (!priIsPrimeW(p[0], stack))
	{
		p[0] += 2;
		if (wwBitSize(p, 1) != l)
		{
			l = 0;
			return FALSE;
		}
	}
	l = 0;
	return TRUE;
}